

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void setvarchecked(ident *id,int val)

{
  uint uVar1;
  char *pcVar2;
  char *fmt;
  
  uVar1 = id->flags;
  if ((uVar1 & 8) != 0) {
    pcVar2 = id->name;
    fmt = "variable %s is read-only";
LAB_00127841:
    debugcode(fmt,pcVar2);
    return;
  }
  if ((uVar1 & 2) == 0 && (identflags & 0x10U) == 0) {
    if ((uVar1 & 0x10) == 0) goto LAB_00127800;
    uVar1 = uVar1 & 0xffffffe5;
  }
  else {
    if ((uVar1 & 1) != 0) {
      pcVar2 = id->name;
      fmt = "cannot override persistent variable %s";
      goto LAB_00127841;
    }
    if ((uVar1 & 0x10) != 0) goto LAB_00127800;
    (id->field_5).argmask = *(uint *)(id->field_4).args;
    uVar1 = uVar1 | 0x10;
  }
  id->flags = uVar1;
LAB_00127800:
  if ((id->field_3).maxval < val || val < (id->field_2).minval) {
    val = clampvar(id,val,(id->field_2).minval,(id->field_3).maxval);
  }
  *(int *)(id->field_4).args = val;
  if (id->fun != (identfun)0x0) {
    (*id->fun)();
    return;
  }
  return;
}

Assistant:

void setvarchecked(ident *id, int val)
{
    if(id->flags&IDF_READONLY) debugcode("variable %s is read-only", id->name);
else
    {
        OVERRIDEVAR(return, id->overrideval.i = *id->storage.i, , )
        if(val < id->minval || val > id->maxval) val = clampvar(id, val, id->minval, id->maxval);
        *id->storage.i = val;
        id->changed();                                             // call trigger function if available
    }
}